

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group.cxx
# Opt level: O2

void __thiscall Fl_Group::clear(Fl_Group *this)

{
  Fl_Widget **ppFVar1;
  Fl_Widget *pFVar2;
  int iVar3;
  ulong uVar4;
  Fl_Widget **ppFVar5;
  Fl_Widget ***pppFVar6;
  uint uVar7;
  long lVar8;
  Fl_Group *o;
  
  this->savedfocus_ = (Fl_Widget *)0x0;
  this->resizable_ = &this->super_Fl_Widget;
  init_sizes(this);
  o = (Fl_Group *)Fl::pushed_;
  iVar3 = Fl_Widget::contains(&this->super_Fl_Widget,Fl::pushed_);
  if (iVar3 != 0) {
    o = this;
  }
  Fl::pushed(&this->super_Fl_Widget);
  uVar7 = this->children_;
  uVar4 = (ulong)uVar7;
  if (1 < (int)uVar7) {
    ppFVar1 = this->array_;
    ppFVar5 = ppFVar1;
    for (lVar8 = 0; -lVar8 != (ulong)(uVar7 >> 1); lVar8 = lVar8 + -1) {
      pFVar2 = *ppFVar5;
      *ppFVar5 = ppFVar1[uVar4 + lVar8 + -1];
      ppFVar1[uVar4 + lVar8 + -1] = pFVar2;
      ppFVar5 = ppFVar5 + 1;
    }
  }
  while (iVar3 = (int)uVar4, iVar3 != 0) {
    pppFVar6 = &this->array_;
    if (1 < iVar3) {
      pppFVar6 = (Fl_Widget ***)this->array_;
    }
    uVar7 = iVar3 - 1;
    ppFVar1 = pppFVar6[(long)iVar3 + -1];
    if ((Fl_Group *)ppFVar1[1] == this) {
      if (iVar3 < 3) {
        remove(this,(char *)(ulong)uVar7);
      }
      else {
        ppFVar1[1] = (Fl_Widget *)0x0;
        this->children_ = uVar7;
      }
      (*(code *)(*ppFVar1)->parent_)(ppFVar1);
    }
    else {
      remove(this,(char *)(ulong)uVar7);
    }
    uVar4 = (ulong)(uint)this->children_;
  }
  if (o != this) {
    Fl::pushed(&o->super_Fl_Widget);
    return;
  }
  return;
}

Assistant:

void Fl_Group::clear() {
  savedfocus_ = 0;
  resizable_ = this;
  init_sizes();

  // we must change the Fl::pushed() widget, if it is one of
  // the group's children. Otherwise fl_fix_focus() would send
  // lots of events to children that are about to be deleted
  // anyway.

  Fl_Widget *pushed = Fl::pushed();	// save pushed() widget
  if (contains(pushed)) pushed = this;	// set it to be the group, if it's a child
  Fl::pushed(this);			// for fl_fix_focus etc.

  // okay, now it is safe to destroy the children:

#define REVERSE_CHILDREN
#ifdef  REVERSE_CHILDREN
  // Reverse the order of the children. Doing this and deleting
  // always the last child is much faster than the other way around.
  if (children_ > 1) {
    Fl_Widget *temp;
    Fl_Widget **a = (Fl_Widget**)array();
    for (int i=0,j=children_-1; i<children_/2; i++,j--) {
      temp = a[i];
      a[i] = a[j];
      a[j] = temp;
    }
  }
#endif // REVERSE_CHILDREN

  while (children_) {			// delete all children
    int idx = children_-1;		// last child's index
    Fl_Widget* w = child(idx);		// last child widget
    if (w->parent()==this) {		// should always be true
      if (children_>2) {		// optimized removal
        w->parent_ = 0;			// reset child's parent
        children_--;			// update counter
      } else {				// slow removal
        remove(idx);
      }
      delete w;				// delete the child
    } else {				// should never happen
      remove(idx);			// remove it anyway
    }
  }

  if (pushed != this) Fl::pushed(pushed); // reset pushed() widget

}